

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O2

bool __thiscall CFileCollection::IsFilenameValid(CFileCollection *this,char *pFilename)

{
  int iVar1;
  long lVar2;
  
  iVar1 = str_length(pFilename);
  if ((((((iVar1 == this->m_FileExtLength + this->m_FileDescLength + 0x14) &&
         (iVar1 = str_comp_num(pFilename,this->m_aFileDesc,this->m_FileDescLength), iVar1 == 0)) &&
        (iVar1 = str_comp(pFilename + (long)this->m_FileDescLength + 0x14,this->m_aFileExt),
        iVar1 == 0)) &&
       (((lVar2 = (long)this->m_FileDescLength, pFilename[lVar2] == '_' &&
         ((byte)(pFilename[lVar2 + 1] - 0x30U) < 10)) &&
        (((byte)(pFilename[lVar2 + 2] - 0x30U) < 10 &&
         (((byte)(pFilename[lVar2 + 3] - 0x30U) < 10 && ((byte)(pFilename[lVar2 + 4] - 0x30U) < 10))
         )))))) &&
      ((pFilename[lVar2 + 5] == '-' &&
       (((((((byte)(pFilename[lVar2 + 6] - 0x30U) < 10 &&
            ((byte)(pFilename[lVar2 + 7] - 0x30U) < 10)) && (pFilename[lVar2 + 8] == '-')) &&
          (((byte)(pFilename[lVar2 + 9] - 0x30U) < 10 &&
           ((byte)(pFilename[lVar2 + 10] - 0x30U) < 10)))) &&
         ((pFilename[lVar2 + 0xb] == '_' &&
          (((byte)(pFilename[lVar2 + 0xc] - 0x30U) < 10 &&
           ((byte)(pFilename[lVar2 + 0xd] - 0x30U) < 10)))))) && (pFilename[lVar2 + 0xe] == '-')))))
      ) && (((((byte)(pFilename[lVar2 + 0xf] - 0x30U) < 10 &&
              ((byte)(pFilename[lVar2 + 0x10] - 0x30U) < 10)) && (pFilename[lVar2 + 0x11] == '-'))
            && (((byte)(pFilename[lVar2 + 0x12] - 0x30U) < 10 &&
                ((byte)(pFilename[lVar2 + 0x13] - 0x30U) < 10)))))) {
    return true;
  }
  return false;
}

Assistant:

bool CFileCollection::IsFilenameValid(const char *pFilename)
{
	if(str_length(pFilename) != m_FileDescLength+TIMESTAMP_LENGTH+m_FileExtLength ||
		str_comp_num(pFilename, m_aFileDesc, m_FileDescLength) ||
		str_comp(pFilename+m_FileDescLength+TIMESTAMP_LENGTH, m_aFileExt))
		return false;

	pFilename += m_FileDescLength;
	if(pFilename[0] == '_' &&
		pFilename[1] >= '0' && pFilename[1] <= '9' &&
		pFilename[2] >= '0' && pFilename[2] <= '9' &&
		pFilename[3] >= '0' && pFilename[3] <= '9' &&
		pFilename[4] >= '0' && pFilename[4] <= '9' &&
		pFilename[5] == '-' &&
		pFilename[6] >= '0' && pFilename[6] <= '9' &&
		pFilename[7] >= '0' && pFilename[7] <= '9' &&
		pFilename[8] == '-' &&
		pFilename[9] >= '0' && pFilename[9] <= '9' &&
		pFilename[10] >= '0' && pFilename[10] <= '9' &&
		pFilename[11] == '_' &&
		pFilename[12] >= '0' && pFilename[12] <= '9' &&
		pFilename[13] >= '0' && pFilename[13] <= '9' &&
		pFilename[14] == '-' &&
		pFilename[15] >= '0' && pFilename[15] <= '9' &&
		pFilename[16] >= '0' && pFilename[16] <= '9' &&
		pFilename[17] == '-' &&
		pFilename[18] >= '0' && pFilename[18] <= '9' &&
		pFilename[19] >= '0' && pFilename[19] <= '9')
		return true;

	return false;
}